

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O3

void aom_yv12_copy_frame_c(YV12_BUFFER_CONFIG *src_bc,YV12_BUFFER_CONFIG *dst_bc,int num_planes)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  
  if ((src_bc->flags & 8) == 0) {
    if (0 < num_planes) {
      uVar1 = 0;
      do {
        if (0 < *(int *)((long)src_bc->store_buf_adr + (ulong)(uVar1 != 0) * 4 + -0x40)) {
          puVar4 = dst_bc->store_buf_adr[uVar1 - 4];
          puVar5 = src_bc->store_buf_adr[uVar1 - 4];
          iVar2 = 0;
          lVar3 = (ulong)(uVar1 != 0) * 4;
          do {
            memcpy(puVar4,puVar5,(long)*(int *)((long)src_bc->store_buf_adr + lVar3 + -0x48));
            puVar5 = puVar5 + *(int *)((long)src_bc->store_buf_adr + lVar3 + -0x28);
            puVar4 = puVar4 + *(int *)((long)dst_bc->store_buf_adr + lVar3 + -0x28);
            iVar2 = iVar2 + 1;
          } while (iVar2 < *(int *)((long)src_bc->store_buf_adr + lVar3 + -0x40));
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 != (uint)num_planes);
    }
  }
  else if (0 < num_planes) {
    uVar1 = 0;
    do {
      if (0 < *(int *)((long)src_bc->store_buf_adr + (ulong)(uVar1 != 0) * 4 + -0x40)) {
        puVar4 = dst_bc->store_buf_adr[uVar1 - 4];
        puVar5 = src_bc->store_buf_adr[uVar1 - 4];
        iVar2 = 0;
        lVar3 = (ulong)(uVar1 != 0) * 4;
        do {
          memcpy((void *)((long)puVar4 * 2),(void *)((long)puVar5 * 2),
                 (long)*(int *)((long)src_bc->store_buf_adr + lVar3 + -0x48) * 2);
          puVar5 = puVar5 + *(int *)((long)src_bc->store_buf_adr + lVar3 + -0x28);
          puVar4 = puVar4 + *(int *)((long)dst_bc->store_buf_adr + lVar3 + -0x28);
          iVar2 = iVar2 + 1;
        } while (iVar2 < *(int *)((long)src_bc->store_buf_adr + lVar3 + -0x40));
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != (uint)num_planes);
  }
  aom_yv12_extend_frame_borders_c(dst_bc,num_planes);
  return;
}

Assistant:

void aom_yv12_copy_frame_c(const YV12_BUFFER_CONFIG *src_bc,
                           YV12_BUFFER_CONFIG *dst_bc, const int num_planes) {
  assert(src_bc->y_width == dst_bc->y_width);
  assert(src_bc->y_height == dst_bc->y_height);

#if CONFIG_AV1_HIGHBITDEPTH
  assert((src_bc->flags & YV12_FLAG_HIGHBITDEPTH) ==
         (dst_bc->flags & YV12_FLAG_HIGHBITDEPTH));

  if (src_bc->flags & YV12_FLAG_HIGHBITDEPTH) {
    for (int plane = 0; plane < num_planes; ++plane) {
      const uint8_t *plane_src = src_bc->buffers[plane];
      uint8_t *plane_dst = dst_bc->buffers[plane];
      const int is_uv = plane > 0;

      for (int row = 0; row < src_bc->heights[is_uv]; ++row) {
        memcpy_short_addr(plane_dst, plane_src, src_bc->widths[is_uv]);
        plane_src += src_bc->strides[is_uv];
        plane_dst += dst_bc->strides[is_uv];
      }
    }
    aom_yv12_extend_frame_borders_c(dst_bc, num_planes);
    return;
  }
#endif
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint8_t *plane_src = src_bc->buffers[plane];
    uint8_t *plane_dst = dst_bc->buffers[plane];
    const int is_uv = plane > 0;

    for (int row = 0; row < src_bc->heights[is_uv]; ++row) {
      memcpy(plane_dst, plane_src, src_bc->widths[is_uv]);
      plane_src += src_bc->strides[is_uv];
      plane_dst += dst_bc->strides[is_uv];
    }
  }
  aom_yv12_extend_frame_borders_c(dst_bc, num_planes);
}